

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_log_add_fd(int fd,float sample_ratio,char *_points,char *_snis,char *_addresses,int appdata
                   )

{
  char cVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  char *__ptr;
  char *__ptr_00;
  size_t sVar5;
  in6_addr *__ptr_01;
  char **ppcVar6;
  long lVar7;
  char *__s;
  size_t sVar8;
  in6_addr *__buf;
  undefined1 auVar9 [16];
  in_addr v4;
  uint32_t local_3c;
  char *local_38;
  
  pthread_mutex_lock((pthread_mutex_t *)&logctx.mutex);
  __ptr = duplicate_stringlist(_points);
  iVar4 = 0x201;
  if ((__ptr == (char *)0x0) || (__ptr_00 = duplicate_stringlist(_snis), __ptr_00 == (char *)0x0)) {
    __ptr_00 = (char *)0x0;
    __ptr_01 = (in6_addr *)0x0;
    bVar3 = false;
  }
  else {
    sVar8 = 0x10;
    if (_addresses != (char *)0x0) {
      cVar1 = *_addresses;
      __s = _addresses;
      while (cVar1 != '\0') {
        sVar5 = strlen(__s);
        __s = __s + sVar5 + 1;
        sVar8 = sVar8 + 0x10;
        cVar1 = *__s;
      }
    }
    __ptr_01 = (in6_addr *)malloc(sVar8);
    if (__ptr_01 != (in6_addr *)0x0) {
      local_38 = __ptr_00;
      if ((_addresses == (char *)0x0) || (*_addresses == '\0')) {
        lVar7 = 0;
      }
      else {
        lVar7 = 0;
        do {
          __buf = __ptr_01 + lVar7;
          iVar4 = inet_pton(10,_addresses,__buf);
          if (iVar4 == 0) {
            iVar4 = inet_pton(2,_addresses,&local_3c);
            if (iVar4 != 0) {
              *(undefined8 *)((long)&__buf->__in6_u + 8) = 0xffff0000;
              *(undefined8 *)&__buf->__in6_u = 0;
              (__buf->__in6_u).__u6_addr32[3] = local_3c;
              goto LAB_00118f37;
            }
          }
          else {
LAB_00118f37:
            auVar9[0] = -(in6addr_any == (__buf->__in6_u).__u6_addr8[0]);
            auVar9[1] = -(uRam000000000013c3a9 == (__buf->__in6_u).__u6_addr8[1]);
            auVar9[2] = -(uRam000000000013c3aa == (__buf->__in6_u).__u6_addr8[2]);
            auVar9[3] = -(uRam000000000013c3ab == (__buf->__in6_u).__u6_addr8[3]);
            auVar9[4] = -(uRam000000000013c3ac == (__buf->__in6_u).__u6_addr8[4]);
            auVar9[5] = -(uRam000000000013c3ad == (__buf->__in6_u).__u6_addr8[5]);
            auVar9[6] = -(uRam000000000013c3ae == (__buf->__in6_u).__u6_addr8[6]);
            auVar9[7] = -(uRam000000000013c3af == (__buf->__in6_u).__u6_addr8[7]);
            auVar9[8] = -(EVP_aes_128_ecb == (code)(__buf->__in6_u).__u6_addr8[8]);
            auVar9[9] = -(uRam000000000013c3b1 == (__buf->__in6_u).__u6_addr8[9]);
            auVar9[10] = -(uRam000000000013c3b2 == (__buf->__in6_u).__u6_addr8[10]);
            auVar9[0xb] = -(uRam000000000013c3b3 == (__buf->__in6_u).__u6_addr8[0xb]);
            auVar9[0xc] = -(uRam000000000013c3b4 == (__buf->__in6_u).__u6_addr8[0xc]);
            auVar9[0xd] = -(uRam000000000013c3b5 == (__buf->__in6_u).__u6_addr8[0xd]);
            auVar9[0xe] = -(uRam000000000013c3b6 == (__buf->__in6_u).__u6_addr8[0xe]);
            auVar9[0xf] = -(uRam000000000013c3b7 == (__buf->__in6_u).__u6_addr8[0xf]);
            lVar7 = lVar7 + (ulong)((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                             (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                             (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                             (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                             (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                             (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                             (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                             (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                             (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                             (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                             (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                             (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                             (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                             (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                             (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                            (ushort)(auVar9[0xf] >> 7) << 0xf) != 0xffff);
          }
          sVar8 = strlen(_addresses);
          _addresses = _addresses + sVar8 + 1;
        } while (*_addresses != '\0');
      }
      uVar2 = CONCAT17(uRam000000000013c3b7,
                       CONCAT16(uRam000000000013c3b6,
                                CONCAT15(uRam000000000013c3b5,
                                         CONCAT14(uRam000000000013c3b4,
                                                  CONCAT13(uRam000000000013c3b3,
                                                           CONCAT12(uRam000000000013c3b2,
                                                                    CONCAT11(uRam000000000013c3b1,
                                                                             EVP_aes_128_ecb)))))));
      *(ulong *)&__ptr_01[lVar7].__in6_u =
           CONCAT17(uRam000000000013c3af,
                    CONCAT16(uRam000000000013c3ae,
                             CONCAT15(uRam000000000013c3ad,
                                      CONCAT14(uRam000000000013c3ac,
                                               CONCAT13(uRam000000000013c3ab,
                                                        CONCAT12(uRam000000000013c3aa,
                                                                 CONCAT11(uRam000000000013c3a9,
                                                                          in6addr_any)))))));
      *(undefined8 *)((long)&__ptr_01[lVar7].__in6_u + 8) = uVar2;
      __ptr_00 = local_38;
      if (__ptr_01 != (in6_addr *)0x0) {
        ppcVar6 = &logctx.conns[0].points;
        lVar7 = 0;
        iVar4 = 0x201;
        do {
          if (*ppcVar6 == (char *)0x0) goto LAB_00118fc6;
          lVar7 = lVar7 + 1;
          ppcVar6 = ppcVar6 + 5;
        } while (lVar7 != 0x20);
        lVar7 = 0x20;
LAB_00118fc6:
        bVar3 = false;
        if (lVar7 != 0x20) {
          logctx.conns[lVar7].fd = fd;
          logctx.conns[lVar7].points = __ptr;
          logctx.conns[lVar7].snis = local_38;
          logctx.conns[lVar7].addresses = __ptr_01;
          logctx.conns[lVar7].sample_ratio = sample_ratio;
          logctx.conns[lVar7].field_0x24 = logctx.conns[lVar7].field_0x24 & 0xfe | (byte)appdata & 1
          ;
          ptls_log._generation = ptls_log._generation + 1;
          bVar3 = true;
          iVar4 = 0;
        }
        goto LAB_00119030;
      }
    }
    bVar3 = false;
    iVar4 = 0x201;
  }
LAB_00119030:
  pthread_mutex_unlock((pthread_mutex_t *)&logctx.mutex);
  if (!bVar3) {
    free(__ptr);
    free(__ptr_00);
    free(__ptr_01);
  }
  return iVar4;
}

Assistant:

int ptls_log_add_fd(int fd, float sample_ratio, const char *_points, const char *_snis, const char *_addresses, int appdata)
{
#if PTLS_HAVE_LOG

    char *points = NULL, *snis = NULL;
    struct in6_addr *addresses = NULL;
    int ret;

    pthread_mutex_lock(&logctx.mutex);

    if ((points = duplicate_stringlist(_points)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((snis = duplicate_stringlist(_snis)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    {
        size_t num_addresses = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1)
            ++num_addresses;
        if ((addresses = malloc(sizeof(*addresses) * (num_addresses + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        size_t index = 0;
        for (const char *input = _addresses; input != NULL && *input != '\0'; input += strlen(input) + 1) {
            /* note: for consistency to the handling of points, erroneous input is ignored. V4 addresses will use the mapped form
             * (::ffff:192.0.2.1) */
            if (!inet_pton(AF_INET6, input, &addresses[index])) {
                struct in_addr v4;
                if (!inet_pton(AF_INET, input, &v4))
                    continue;
                ptls_build_v4_mapped_v6_address(&addresses[index], &v4);
            }
            if (memcmp(&addresses[index], &in6addr_any, sizeof(struct in6_addr)) == 0)
                continue;
            ++index;
        }
        addresses[index] = in6addr_any;
    }

    /* find slot, or return if not available */
    size_t slot_index;
    for (slot_index = 0; slot_index < PTLS_ELEMENTSOF(logctx.conns); ++slot_index)
        if (logctx.conns[slot_index].points == NULL)
            break;
    if (slot_index == PTLS_ELEMENTSOF(logctx.conns)) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    /* setup the slot */
    logctx.conns[slot_index].fd = fd;
    logctx.conns[slot_index].points = points;
    logctx.conns[slot_index].snis = snis;
    logctx.conns[slot_index].addresses = addresses;
    logctx.conns[slot_index].sample_ratio = sample_ratio;
    logctx.conns[slot_index].appdata = appdata;
    ++ptls_log._generation;

    ret = 0; /* success */

Exit:
    pthread_mutex_unlock(&logctx.mutex);
    if (ret != 0) {
        free(points);
        free(snis);
        free(addresses);
    }
    return ret;

#else
    return PTLS_ERROR_NOT_AVAILABLE;
#endif
}